

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_yell(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  ROOM_INDEX_DATA *pRVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  DESCRIPTOR_DATA **ppDVar7;
  char buf [4608];
  
  pcVar6 = buf;
  bVar3 = is_affected(ch,(int)gsn_silence);
  if (bVar3) {
    pcVar6 = "You cannot find the words within you.\n\r";
    goto LAB_0029e5fb;
  }
  if ((ch->comm[0] & 0x100000) == 0) {
    bVar3 = is_shifted(ch);
    if (bVar3) {
      bVar3 = is_immortal(ch);
      if (!bVar3) goto LAB_0029e5f4;
    }
    bVar3 = is_affected(ch,(int)gsn_mangled);
    if (bVar3) {
      pcVar6 = "Your torn throat prevents you from getting the words out.\n\r";
    }
    else if (*argument == '\0') {
      pcVar6 = "Yell what?\n\r";
    }
    else {
      bVar3 = is_affected(ch,(int)gsn_imprisonvoice);
      if (bVar3) {
        pcVar6 = "Your vocal cords are frozen solid!\n\r";
      }
      else {
        bVar3 = is_affected(ch,(int)gsn_gag);
        if (bVar3) {
          act("You are gagged and cannot speak!",ch,(void *)0x0,(void *)0x0,3);
          act("Muffled sounds emanate from $n\'s direction as $e attempts in vain to speak through $s gag."
              ,ch,(void *)0x0,(void *)0x0,0);
          return;
        }
        bVar3 = is_affected(ch,(int)gsn_uppercut);
        if (!bVar3) {
          bVar3 = is_affected(ch,(int)gsn_deafen);
          if (bVar3) {
            pcVar5 = upstring(argument);
            argument = palloc_string(pcVar5);
          }
          check_ooc(ch,argument,"YELL");
          bVar4 = str_cmp(ch->name,"Karsus");
          if (!bVar4) {
            pcVar5 = strstr(argument,"eing");
            if (pcVar5 != (char *)0x0) {
              pcVar5 = strstr(argument,"being");
              if (pcVar5 == (char *)0x0) {
                send_to_char("***It\'s \'ING\', not \'EING\' you fooker!!!***\n\r",ch);
                send_to_char("***It\'s \'ING\', not \'EING\' you fooker!!!***\n\r",ch);
                send_to_char("***It\'s \'ING\', not \'EING\' you fooker!!!***\n\r",ch);
              }
            }
          }
          if ((ch->comm[0] & 0x400) == 0) {
            pcVar6 = "You yell \'$t\'";
          }
          else {
            pcVar5 = get_char_color(ch,"yells");
            END_COLOR(ch);
            sprintf(buf,"You yell \'%s$t%s\'",pcVar5);
          }
          act(pcVar6,ch,argument,(void *)0x0,3);
          ppDVar7 = &descriptor_list;
          while (ppDVar7 = &((DESCRIPTOR_DATA *)ppDVar7)->next->next,
                (DESCRIPTOR_DATA *)ppDVar7 != (DESCRIPTOR_DATA *)0x0) {
            if ((((((DESCRIPTOR_DATA *)ppDVar7)->connected == 0) &&
                 (pCVar1 = ((DESCRIPTOR_DATA *)ppDVar7)->character, pCVar1 != ch)) &&
                (pRVar2 = pCVar1->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)) &&
               (((pRVar2->area == ch->in_room->area && ((pCVar1->comm[0] & 1) == 0)) &&
                ((pRVar2->room_flags[0] & 0x200000) == 0)))) {
              bVar4 = is_awake(pCVar1);
              if (bVar4) {
                pcVar6 = get_char_color(((DESCRIPTOR_DATA *)ppDVar7)->character,"yells");
                pcVar5 = END_COLOR(((DESCRIPTOR_DATA *)ppDVar7)->character);
                sprintf(buf,"$n yells \'%s$t%s\'",pcVar6,pcVar5);
                act_new(buf,ch,argument,((DESCRIPTOR_DATA *)ppDVar7)->character,2,4);
                bVar4 = is_affected(((DESCRIPTOR_DATA *)ppDVar7)->character,(int)gsn_word_of_command
                                   );
                if (bVar4) {
                  pCVar1 = ((DESCRIPTOR_DATA *)ppDVar7)->character;
                  pcVar6 = strstr(argument,pCVar1->pcdata->command[0]);
                  if (pcVar6 != (char *)0x0) {
                    command_execute(pCVar1);
                  }
                }
              }
            }
          }
          if (bVar3) {
            free_pstring(argument);
          }
          return;
        }
        pcVar6 = "Your jaw hurts too much to move.\n\r";
      }
    }
  }
  else {
LAB_0029e5f4:
    pcVar6 = "You can\'t yell.\n\r";
  }
LAB_0029e5fb:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_yell(CHAR_DATA *ch, char *argument)
{
	if (is_affected(ch, gsn_silence))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOSHOUT) || (is_shifted(ch) && !is_immortal(ch)))
	{
		send_to_char("You can't yell.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_mangled))
	{
		send_to_char("Your torn throat prevents you from getting the words out.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Yell what?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		act("You are gagged and cannot speak!", ch, nullptr, nullptr, TO_CHAR);
		act("Muffled sounds emanate from $n's direction as $e attempts in vain to speak through $s gag.", ch, nullptr, nullptr, TO_ROOM);
		return;
	}

	if (is_affected(ch, gsn_uppercut))
	{
		send_to_char("Your jaw hurts too much to move.\n\r", ch);
		return;
	}

	auto deaf = false;
	if (is_affected(ch, gsn_deafen))
	{
		deaf = true;
		argument = palloc_string(upstring(argument));
	}

	check_ooc(ch, argument, "YELL");

	if (!str_cmp(ch->name, "Karsus") && strstr(argument, "eing") && !strstr(argument, "being"))
	{
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
		send_to_char("***It's 'ING', not 'EING' you fooker!!!***\n\r", ch);
	}

	char buf[MAX_STRING_LENGTH];
	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf, "You yell '%s$t%s'", get_char_color(ch, "yells"), END_COLOR(ch));
		act(buf, ch, argument, nullptr, TO_CHAR);
	}
	else
	{
		act("You yell '$t'", ch, argument, nullptr, TO_CHAR);
	}

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character != ch && d->character->in_room != nullptr && d->character->in_room->area == ch->in_room->area && !IS_SET(d->character->comm, COMM_QUIET))
		{
			if (IS_SET(d->character->in_room->room_flags, ROOM_SILENCE))
				continue;

			/* Can't hear yells while asleep, MORGLUM */
			if (!is_awake(d->character))
				continue;

			sprintf(buf, "$n yells '%s$t%s'", get_char_color(d->character, "yells"), END_COLOR(d->character));
			act_new(buf, ch, argument, d->character, TO_VICT, POS_SLEEPING);

			if (is_affected(d->character, gsn_word_of_command) && strstr(argument, d->character->pcdata->command[0]))
				command_execute(d->character);
		}
	}

	if (deaf)
		free_pstring(argument);
}